

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O1

Float pbrt::FresnelMoment1(Float eta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  
  auVar5._4_60_ = in_register_00001204;
  auVar5._0_4_ = eta;
  fVar1 = eta * eta;
  fVar2 = fVar1 * eta;
  fVar3 = fVar2 * eta;
  if (eta < 1.0) {
    auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbfdeacda),0),auVar5._0_16_,ZEXT416(0x3eeb588e));
    auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar1),ZEXT416(0x40581b86));
    auVar4._0_8_ = (double)auVar6._0_4_;
    auVar4._8_8_ = auVar6._8_8_;
    auVar6._0_8_ = (double)fVar2;
    auVar6._8_8_ = 0;
    auVar6 = vfmadd132sd_fma(auVar6,auVar4,ZEXT816(0xc00f3d53cddd6e05));
    return (float)(auVar6._0_8_ + (double)(fVar3 * 2.49277) + (double)(fVar3 * eta * -0.68441));
  }
  auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x4131d14e),0),auVar5._0_16_,ZEXT416(0xc093bd51));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar1),ZEXT416(0xc1276f00));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar2),ZEXT416(0x40a3aa65));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar3),ZEXT416(0xbfa2d03e));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)(fVar3 * eta)),ZEXT416(0x3e0284e0));
  return auVar6._0_4_;
}

Assistant:

Float FresnelMoment1(Float eta) {
    Float eta2 = eta * eta, eta3 = eta2 * eta, eta4 = eta3 * eta, eta5 = eta4 * eta;
    if (eta < 1)
        return 0.45966f - 1.73965f * eta + 3.37668f * eta2 - 3.904945 * eta3 +
               2.49277f * eta4 - 0.68441f * eta5;
    else
        return -4.61686f + 11.1136f * eta - 10.4646f * eta2 + 5.11455f * eta3 -
               1.27198f * eta4 + 0.12746f * eta5;
}